

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void ARGBCopyAlphaRow_SSE2(uint8_t *src,uint8_t *dst,int width)

{
  bool bVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  int iVar10;
  
  do {
    uVar2 = src[3];
    uVar3 = src[7];
    uVar4 = src[0xb];
    uVar5 = src[0xf];
    uVar6 = src[0x13];
    uVar7 = src[0x17];
    uVar8 = src[0x1b];
    uVar9 = src[0x1f];
    src = src + 0x20;
    *dst = *dst;
    dst[1] = dst[1];
    dst[2] = dst[2];
    dst[3] = uVar2;
    dst[4] = dst[4];
    dst[5] = dst[5];
    dst[6] = dst[6];
    dst[7] = uVar3;
    dst[8] = dst[8];
    dst[9] = dst[9];
    dst[10] = dst[10];
    dst[0xb] = uVar4;
    dst[0xc] = dst[0xc];
    dst[0xd] = dst[0xd];
    dst[0xe] = dst[0xe];
    dst[0xf] = uVar5;
    dst[0x10] = dst[0x10];
    dst[0x11] = dst[0x11];
    dst[0x12] = dst[0x12];
    dst[0x13] = uVar6;
    dst[0x14] = dst[0x14];
    dst[0x15] = dst[0x15];
    dst[0x16] = dst[0x16];
    dst[0x17] = uVar7;
    dst[0x18] = dst[0x18];
    dst[0x19] = dst[0x19];
    dst[0x1a] = dst[0x1a];
    dst[0x1b] = uVar8;
    dst[0x1c] = dst[0x1c];
    dst[0x1d] = dst[0x1d];
    dst[0x1e] = dst[0x1e];
    dst[0x1f] = uVar9;
    dst = dst + 0x20;
    iVar10 = width + -8;
    bVar1 = 7 < width;
    width = iVar10;
  } while (iVar10 != 0 && bVar1);
  return;
}

Assistant:

void ARGBCopyAlphaRow_SSE2(const uint8_t* src, uint8_t* dst, int width) {
  asm volatile(
      "pcmpeqb     %%xmm0,%%xmm0                 \n"
      "pslld       $0x18,%%xmm0                  \n"
      "pcmpeqb     %%xmm1,%%xmm1                 \n"
      "psrld       $0x8,%%xmm1                   \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm2                   \n"
      "movdqu      0x10(%0),%%xmm3               \n"
      "lea         0x20(%0),%0                   \n"
      "movdqu      (%1),%%xmm4                   \n"
      "movdqu      0x10(%1),%%xmm5               \n"
      "pand        %%xmm0,%%xmm2                 \n"
      "pand        %%xmm0,%%xmm3                 \n"
      "pand        %%xmm1,%%xmm4                 \n"
      "pand        %%xmm1,%%xmm5                 \n"
      "por         %%xmm4,%%xmm2                 \n"
      "por         %%xmm5,%%xmm3                 \n"
      "movdqu      %%xmm2,(%1)                   \n"
      "movdqu      %%xmm3,0x10(%1)               \n"
      "lea         0x20(%1),%1                   \n"
      "sub         $0x8,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src),   // %0
        "+r"(dst),   // %1
        "+r"(width)  // %2
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5");
}